

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O2

ssize_t __thiscall
libnbt::NBTTagString::read(NBTTagString *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  int16_t length_00;
  undefined4 in_register_00000034;
  int16_t length;
  string local_38;
  
  length_00 = (int16_t)__nbytes;
  length = 0;
  readBytes((istream *)CONCAT44(in_register_00000034,__fd),(char *)&length,'\x02');
  readString_abi_cxx11_
            (&local_38,(libnbt *)CONCAT44(in_register_00000034,__fd),
             (istream *)(ulong)(uint)(int)length,length_00);
  std::__cxx11::string::operator=
            ((string *)
             &(this->
              super_NBTTagData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )._data,(string *)&local_38);
  sVar1 = std::__cxx11::string::~string((string *)&local_38);
  return sVar1;
}

Assistant:

void NBTTagString::read(std::istream &in) {
        int16_t length = 0;
        readBytes(in, (char *) &length, 2);
        _data = readString(in, length);
    }